

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

monitor * monitor_create(uint32_t id,xcb_rectangle_t rect,workspace *workspace)

{
  monitor *pmVar1;
  
  pmVar1 = (monitor *)malloc(0x20);
  if (pmVar1 == (monitor *)0x0) {
    pmVar1 = (monitor *)0x0;
  }
  else {
    pmVar1->id = id;
    pmVar1->rect = rect;
    pmVar1->workspace = workspace;
  }
  return pmVar1;
}

Assistant:

struct monitor *monitor_create(uint32_t id, xcb_rectangle_t rect, struct workspace *workspace)
{
        struct monitor *monitor = malloc(sizeof(struct monitor));

        if (monitor == NULL) {
                return NULL;
        }

        monitor->id = id;
        monitor->rect = rect;
        monitor->workspace = workspace;

        return monitor;
}